

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportThrowing(TranslateToFuzzReader *this,Type type)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  bool bVar1;
  Call *pCVar2;
  Type local_98 [3];
  allocator<wasm::Expression_*> local_79;
  Const *local_78;
  Const **local_70;
  size_type local_68;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  size_t local_48;
  char *pcStack_40;
  Type local_30;
  Const *local_28;
  Expression *arg;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  arg._4_4_ = 0;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&arg + 4));
  if (!bVar1) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4d4,"Expression *wasm::TranslateToFuzzReader::makeImportThrowing(Type)");
  }
  bVar1 = oneIn(this,2);
  if (bVar1) {
    local_28 = Builder::makeConst<int>(&this->builder,0);
  }
  else {
    Type::Type(&local_30,i32);
    local_28 = (Const *)makeConst(this,local_30);
  }
  local_48 = (this->throwImportName).super_IString.str._M_len;
  pcStack_40 = (this->throwImportName).super_IString.str._M_str;
  local_78 = local_28;
  local_70 = &local_78;
  local_68 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_79);
  __l._M_len = local_68;
  __l._M_array = (iterator)local_70;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_60,__l,&local_79);
  Type::Type(local_98,none);
  target.super_IString.str._M_str = pcStack_40;
  target.super_IString.str._M_len = local_48;
  pCVar2 = Builder::makeCall(&this->builder,target,&local_60,local_98[0],false);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_60);
  std::allocator<wasm::Expression_*>::~allocator(&local_79);
  return (Expression *)pCVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportThrowing(Type type) {
  // TODO: This and makeThrow should probably be rare, as they halt the program.

  // We throw from the import, so this call appears to be none and not
  // unreachable.
  assert(type == Type::none);

  // An argument of 0 means to throw a JS exception, and otherwise the value in
  // a wasm tag. Emit 0 or non-zero with ~equal probability.
  Expression* arg;
  if (oneIn(2)) {
    arg = builder.makeConst(int32_t(0));
  } else {
    arg = makeConst(Type::i32);
  }
  return builder.makeCall(throwImportName, {arg}, Type::none);
}